

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageColorContrast(Image *image,float contrast)

{
  int newFormat;
  Image image_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Color *pCVar5;
  float fVar6;
  undefined8 in_stack_ffffffffffffffc0;
  float local_34;
  int format;
  float pB;
  float pG;
  float pR;
  int x;
  int y;
  Color *pixels;
  float contrast_local;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pixels._4_4_ = contrast;
    if (contrast < -100.0) {
      pixels._4_4_ = -100.0;
    }
    if (100.0 < pixels._4_4_) {
      pixels._4_4_ = 100.0;
    }
    fVar6 = (pixels._4_4_ + 100.0) / 100.0;
    fVar6 = fVar6 * fVar6;
    uVar1 = image->width;
    uVar2 = image->height;
    uVar3 = image->mipmaps;
    uVar4 = image->format;
    image_00.height = uVar4;
    image_00.width = uVar3;
    image_00.data._4_4_ = uVar2;
    image_00.data._0_4_ = uVar1;
    image_00._16_8_ = in_stack_ffffffffffffffc0;
    pCVar5 = LoadImageColors(image_00);
    for (pR = 0.0; (int)pR < image->height; pR = (float)((int)pR + 1)) {
      for (pG = 0.0; (int)pG < image->width; pG = (float)((int)pG + 1)) {
        pB = (fVar6 * ((float)pCVar5[(int)pR * image->width + (int)pG].r / 255.0 - 0.5) + 0.5) *
             255.0;
        if (pB < 0.0) {
          pB = 0.0;
        }
        if (255.0 < pB) {
          pB = 255.0;
        }
        format = (int)((fVar6 * ((float)pCVar5[(int)pR * image->width + (int)pG].g / 255.0 - 0.5) +
                       0.5) * 255.0);
        if ((float)format < 0.0) {
          format = 0;
        }
        if (255.0 < (float)format) {
          format = 0x437f0000;
        }
        local_34 = (fVar6 * ((float)pCVar5[(int)pR * image->width + (int)pG].b / 255.0 - 0.5) + 0.5)
                   * 255.0;
        if (local_34 < 0.0) {
          local_34 = 0.0;
        }
        if (255.0 < local_34) {
          local_34 = 255.0;
        }
        pCVar5[(int)pR * image->width + (int)pG].r = (uchar)(int)pB;
        pCVar5[(int)pR * image->width + (int)pG].g = (uchar)(int)(float)format;
        pCVar5[(int)pR * image->width + (int)pG].b = (uchar)(int)local_34;
      }
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar5;
    image->format = 7;
    ImageFormat(image,newFormat);
  }
  return;
}

Assistant:

void ImageColorContrast(Image *image, float contrast)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (contrast < -100) contrast = -100;
    if (contrast > 100) contrast = 100;

    contrast = (100.0f + contrast)/100.0f;
    contrast *= contrast;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            float pR = (float)pixels[y*image->width + x].r/255.0f;
            pR -= 0.5;
            pR *= contrast;
            pR += 0.5;
            pR *= 255;
            if (pR < 0) pR = 0;
            if (pR > 255) pR = 255;

            float pG = (float)pixels[y*image->width + x].g/255.0f;
            pG -= 0.5;
            pG *= contrast;
            pG += 0.5;
            pG *= 255;
            if (pG < 0) pG = 0;
            if (pG > 255) pG = 255;

            float pB = (float)pixels[y*image->width + x].b/255.0f;
            pB -= 0.5;
            pB *= contrast;
            pB += 0.5;
            pB *= 255;
            if (pB < 0) pB = 0;
            if (pB > 255) pB = 255;

            pixels[y*image->width + x].r = (unsigned char)pR;
            pixels[y*image->width + x].g = (unsigned char)pG;
            pixels[y*image->width + x].b = (unsigned char)pB;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}